

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateFromSelect(Parse *pParse,int iEph,Index *pPk,ExprList *pChanges,SrcList *pTabList,
                     Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  sqlite3 *db_00;
  Table *pTVar1;
  Table *pTVar2;
  SrcList *pSrc_00;
  Expr *pWhere_00;
  Expr *pEVar3;
  Select *p;
  uint local_ec;
  Expr *pNew;
  int eDest;
  Expr *pWhere2;
  SrcList *pSrc;
  Table *pTab;
  sqlite3 *db;
  ExprList *pOrderBy2;
  Expr *pLimit2;
  ExprList *pGrp;
  ExprList *pList;
  Select *pSelect;
  SelectDest dest;
  int i;
  Expr *pWhere_local;
  SrcList *pTabList_local;
  ExprList *pChanges_local;
  Index *pPk_local;
  int iEph_local;
  Parse *pParse_local;
  
  pGrp = (ExprList *)0x0;
  db_00 = pParse->db;
  pTVar1 = pTabList->a[0].pTab;
  pSrc_00 = sqlite3SrcListDup(db_00,pTabList,0);
  pWhere_00 = sqlite3ExprDup(db_00,pWhere,0);
  if (pSrc_00 != (SrcList *)0x0) {
    *(ushort *)&pSrc_00->a[0].fg.field_0x1 = *(ushort *)&pSrc_00->a[0].fg.field_0x1 & 0xfdff | 0x200
    ;
    pSrc_00->a[0].iCursor = -1;
    pTVar2 = pSrc_00->a[0].pTab;
    pTVar2->nTabRef = pTVar2->nTabRef - 1;
    pSrc_00->a[0].pTab = (Table *)0x0;
  }
  if (pPk == (Index *)0x0) {
    if (pTVar1->eTabType == '\x02') {
      for (dest.pOrderBy._4_4_ = 0; dest.pOrderBy._4_4_ < pTVar1->nCol;
          dest.pOrderBy._4_4_ = dest.pOrderBy._4_4_ + 1) {
        pEVar3 = exprRowColumn(pParse,dest.pOrderBy._4_4_);
        pGrp = sqlite3ExprListAppend(pParse,pGrp,pEVar3);
      }
      pNew._4_4_ = 0xe;
    }
    else {
      pNew._4_4_ = 0xf;
      if (pTVar1->eTabType == '\x01') {
        pNew._4_4_ = 0xe;
      }
      pEVar3 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
      pGrp = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar3);
    }
  }
  else {
    for (dest.pOrderBy._4_4_ = 0; dest.pOrderBy._4_4_ < (int)(uint)pPk->nKeyCol;
        dest.pOrderBy._4_4_ = dest.pOrderBy._4_4_ + 1) {
      pEVar3 = exprRowColumn(pParse,(int)pPk->aiColumn[dest.pOrderBy._4_4_]);
      pGrp = sqlite3ExprListAppend(pParse,pGrp,pEVar3);
    }
    pNew._4_4_ = 0xf;
    if (pTVar1->eTabType == '\x01') {
      pNew._4_4_ = 0xe;
    }
  }
  if (pChanges != (ExprList *)0x0) {
    for (dest.pOrderBy._4_4_ = 0; dest.pOrderBy._4_4_ < pChanges->nExpr;
        dest.pOrderBy._4_4_ = dest.pOrderBy._4_4_ + 1) {
      pEVar3 = sqlite3ExprDup(db_00,pChanges->a[dest.pOrderBy._4_4_].pExpr,0);
      pGrp = sqlite3ExprListAppend(pParse,pGrp,pEVar3);
    }
  }
  p = sqlite3SelectNew(pParse,pGrp,pSrc_00,pWhere_00,(ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                       0x820000,(Expr *)0x0);
  if (p != (Select *)0x0) {
    p->selFlags = p->selFlags | 0x8000000;
  }
  sqlite3SelectDestInit((SelectDest *)&pSelect,pNew._4_4_,iEph);
  if (pPk == (Index *)0x0) {
    local_ec = 0xffffffff;
  }
  else {
    local_ec = (uint)pPk->nKeyCol;
  }
  dest._0_4_ = local_ec;
  sqlite3Select(pParse,p,(SelectDest *)&pSelect);
  sqlite3SelectDelete(db_00,p);
  return;
}

Assistant:

static void updateFromSelect(
  Parse *pParse,                  /* Parse context */
  int iEph,                       /* Cursor for open eph. table */
  Index *pPk,                     /* PK if table 0 is WITHOUT ROWID */
  ExprList *pChanges,             /* List of expressions to return */
  SrcList *pTabList,              /* List of tables to select from */
  Expr *pWhere,                   /* WHERE clause for query */
  ExprList *pOrderBy,             /* ORDER BY clause */
  Expr *pLimit                    /* LIMIT clause */
){
  int i;
  SelectDest dest;
  Select *pSelect = 0;
  ExprList *pList = 0;
  ExprList *pGrp = 0;
  Expr *pLimit2 = 0;
  ExprList *pOrderBy2 = 0;
  sqlite3 *db = pParse->db;
  Table *pTab = pTabList->a[0].pTab;
  SrcList *pSrc;
  Expr *pWhere2;
  int eDest;

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( pOrderBy && pLimit==0 ) {
    sqlite3ErrorMsg(pParse, "ORDER BY without LIMIT on UPDATE");
    return;
  }
  pOrderBy2 = sqlite3ExprListDup(db, pOrderBy, 0);
  pLimit2 = sqlite3ExprDup(db, pLimit, 0);
#else
  UNUSED_PARAMETER(pOrderBy);
  UNUSED_PARAMETER(pLimit);
#endif

  pSrc = sqlite3SrcListDup(db, pTabList, 0);
  pWhere2 = sqlite3ExprDup(db, pWhere, 0);

  assert( pTabList->nSrc>1 );
  if( pSrc ){
    pSrc->a[0].fg.notCte = 1;
    pSrc->a[0].iCursor = -1;
    pSrc->a[0].pTab->nTabRef--;
    pSrc->a[0].pTab = 0;
  }
  if( pPk ){
    for(i=0; i<pPk->nKeyCol; i++){
      Expr *pNew = exprRowColumn(pParse, pPk->aiColumn[i]);
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
      if( pLimit ){
        pGrp = sqlite3ExprListAppend(pParse, pGrp, sqlite3ExprDup(db, pNew, 0));
      }
#endif
      pList = sqlite3ExprListAppend(pParse, pList, pNew);
    }
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
  }else if( IsView(pTab) ){
    for(i=0; i<pTab->nCol; i++){
      pList = sqlite3ExprListAppend(pParse, pList, exprRowColumn(pParse, i));
    }
    eDest = SRT_Table;
  }else{
    eDest = IsVirtual(pTab) ? SRT_Table : SRT_Upfrom;
    pList = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
    if( pLimit ){
      pGrp = sqlite3ExprListAppend(pParse, 0, sqlite3PExpr(pParse,TK_ROW,0,0));
    }
#endif
  }
  assert( pChanges!=0 || pParse->db->mallocFailed );
  if( pChanges ){
    for(i=0; i<pChanges->nExpr; i++){
      pList = sqlite3ExprListAppend(pParse, pList,
          sqlite3ExprDup(db, pChanges->a[i].pExpr, 0)
      );
    }
  }
  pSelect = sqlite3SelectNew(pParse, pList,
      pSrc, pWhere2, pGrp, 0, pOrderBy2, SF_UFSrcCheck|SF_IncludeHidden, pLimit2
  );
  if( pSelect ) pSelect->selFlags |= SF_OrderByReqd;
  sqlite3SelectDestInit(&dest, eDest, iEph);
  dest.iSDParm2 = (pPk ? pPk->nKeyCol : -1);
  sqlite3Select(pParse, pSelect, &dest);
  sqlite3SelectDelete(db, pSelect);
}